

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::fixedColAtLower<HighsTripletListSlice>
          (HighsPostsolveStack *this,HighsInt col,double fixValue,double colCost,
          HighsMatrixSlice<HighsTripletListSlice> *colVec)

{
  bool bVar1;
  reference this_00;
  char *pcVar2;
  int __c;
  undefined8 in_RDX;
  int in_ESI;
  iterator *rhs;
  HighsDataStack *in_RDI;
  HighsSliceNonzero *colVal;
  iterator __end0;
  iterator __begin0;
  HighsMatrixSlice<HighsTripletListSlice> *__range2;
  HighsMatrixSlice<HighsTripletListSlice> *in_stack_ffffffffffffff40;
  FixedCol *in_stack_ffffffffffffff48;
  ReductionType type;
  HighsPostsolveStack *in_stack_ffffffffffffff50;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_stack_ffffffffffffff58;
  iterator local_70;
  iterator local_50;
  undefined8 local_30;
  undefined8 local_28;
  int local_c;
  
  local_28 = in_RDX;
  local_c = in_ESI;
  std::
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  ::clear((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           *)0x727219);
  local_30 = local_28;
  HighsMatrixSlice<HighsTripletListSlice>::begin(in_stack_ffffffffffffff40);
  HighsMatrixSlice<HighsTripletListSlice>::end(in_stack_ffffffffffffff40);
  while( true ) {
    rhs = &local_70;
    bVar1 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator!=(&local_50,rhs);
    if (!bVar1) break;
    this_00 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator*(&local_50);
    in_stack_ffffffffffffff50 = (HighsPostsolveStack *)(in_RDI + 6);
    in_stack_ffffffffffffff48 = (FixedCol *)&in_RDI[3].position;
    pcVar2 = HighsSliceNonzero::index(this_00,(char *)rhs,__c);
    in_stack_ffffffffffffff58 =
         (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          *)std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff48,
                       (long)(int)pcVar2);
    HighsSliceNonzero::value(this_00);
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                *)in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff48,
               (double *)in_stack_ffffffffffffff40);
    HighsMatrixSlice<HighsTripletListSlice>::iterator::operator++(&local_50);
  }
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 3),(long)local_c);
  HighsDataStack::push<presolve::HighsPostsolveStack::FixedCol,_0>
            ((HighsDataStack *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  type = (ReductionType)((ulong)in_stack_ffffffffffffff48 >> 0x38);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>(in_RDI,in_stack_ffffffffffffff58);
  reductionAdded(in_stack_ffffffffffffff50,type);
  return;
}

Assistant:

void fixedColAtLower(HighsInt col, double fixValue, double colCost,
                       const HighsMatrixSlice<ColStorageFormat>& colVec) {
    assert(std::isfinite(fixValue));
    colValues.clear();
    for (const HighsSliceNonzero& colVal : colVec)
      colValues.emplace_back(origRowIndex[colVal.index()], colVal.value());

    reductionValues.push(FixedCol{fixValue, colCost, origColIndex[col],
                                  HighsBasisStatus::kLower});
    reductionValues.push(colValues);
    reductionAdded(ReductionType::kFixedCol);
  }